

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

wchar_t menu_add_options(nh_menuitem **items,int *size,int *icount,wchar_t listid,
                        nh_option_desc *options,nh_bool read_only)

{
  nh_option_desc *pnVar1;
  int iVar2;
  uint uVar3;
  nh_menuitem *pnVar4;
  uint uVar5;
  int iVar6;
  char optbuf [256];
  char local_138 [264];
  
  if (options->name == (char *)0x0) {
    iVar6 = *icount;
  }
  else {
    uVar5 = 0;
    do {
      print_option_string(options,local_138);
      iVar6 = *icount;
      iVar2 = *size;
      uVar3 = listid << 10 | uVar5;
      if (read_only != '\0') {
        uVar3 = 0;
      }
      pnVar4 = *items;
      if (iVar2 <= iVar6) {
        *size = iVar2 * 2;
        pnVar4 = (nh_menuitem *)realloc(pnVar4,(long)iVar2 * 0x218);
        *items = pnVar4;
        iVar6 = *icount;
      }
      pnVar4 = pnVar4 + iVar6;
      pnVar4->id = uVar3;
      pnVar4->role = (uint)(read_only == '\0');
      pnVar4->accel = '\0';
      pnVar4->group_accel = '\0';
      pnVar4->selected = '\0';
      strcpy(pnVar4->caption,local_138);
      iVar6 = *icount + 1;
      *icount = iVar6;
      uVar5 = uVar5 + 1;
      pnVar1 = options + 1;
      options = options + 1;
    } while (pnVar1->name != (char *)0x0);
  }
  iVar2 = *size;
  pnVar4 = *items;
  if (iVar2 <= iVar6) {
    *size = iVar2 * 2;
    pnVar4 = (nh_menuitem *)realloc(pnVar4,(long)iVar2 * 0x218);
    *items = pnVar4;
    iVar6 = *icount;
  }
  pnVar4[iVar6].accel = '\0';
  pnVar4[iVar6].group_accel = '\0';
  pnVar4[iVar6].selected = '\0';
  pnVar4[iVar6].caption[0] = '\0';
  pnVar4[iVar6].id = 0;
  pnVar4[iVar6].role = MI_TEXT;
  *icount = *icount + 1;
  return (wchar_t)pnVar4;
}

Assistant:

static int menu_add_options(struct nh_menuitem **items, int *size, int *icount,
	    int listid, struct nh_option_desc *options, nh_bool read_only)
{
    int i, id;
    char optbuf[256];
    
    for (i = 0; options[i].name; i++) {
	id = (listid << 10) | i;
	print_option_string(&options[i], optbuf);
	if (read_only)
	    add_menu_txt(*items, *size, *icount, optbuf, MI_TEXT);
	else
	    add_menu_item(*items, *size, *icount, id, optbuf, 0, 0);
    }
    
    /* add an empty line */
    add_menu_txt(*items, *size, *icount, "", MI_TEXT);
    
    return i;
}